

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes256.c
# Opt level: O2

int aead_aes256gcm_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key,void *iv)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  aesgcm_context_t *ctx_1;
  
  ctx->dispose_crypto = aesgcm_dispose_crypto;
  ctx->do_get_iv = aesgcm_get_iv;
  ctx->do_set_iv = aesgcm_set_iv;
  if (is_enc == 0) {
    pcVar1 = aesgcm_decrypt;
    pcVar4 = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    pcVar6 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    pcVar5 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    pcVar3 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
              *)0x0;
    pcVar2 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_ptls_iovec_t_ptr_size_t_uint64_t_void_ptr_size_t
              *)0x0;
  }
  else {
    pcVar2 = ptls_aead__do_encrypt_v;
    pcVar3 = ptls_aead__do_encrypt;
    pcVar5 = aesgcm_encrypt_final;
    pcVar6 = aesgcm_encrypt_update;
    pcVar4 = aesgcm_encrypt_init;
    pcVar1 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
              *)0x0;
  }
  ctx->do_encrypt_init = pcVar4;
  ctx->do_encrypt_update = pcVar6;
  ctx->do_encrypt_final = pcVar5;
  ctx->do_encrypt = pcVar3;
  ctx->do_encrypt_v = pcVar2;
  ctx->do_decrypt = pcVar1;
  cf_aes_init((cf_aes_context *)(ctx + 1),(uint8_t *)key,ctx->algo->key_size);
  *(undefined4 *)&ctx[6].do_encrypt_update = *(undefined4 *)((long)iv + 8);
  ctx[6].do_encrypt_init = *iv;
  return 0;
}

Assistant:

static int aead_aes256gcm_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key, const void *iv)
{
    return aead_aesgcm_setup_crypto(ctx, is_enc, key, iv);
}